

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

uchar * kj::_::CopyConstructArray_<unsigned_char,_kj::Repeat<unsigned_char>::Iterator,_false,_false>
        ::apply(uchar *pos,Iterator start,Iterator end)

{
  uchar *location;
  bool bVar1;
  uchar *params;
  Iterator IVar2;
  Iterator local_60 [2];
  undefined1 local_40 [8];
  ExceptionGuard guard;
  uchar *pos_local;
  Iterator end_local;
  Iterator start_local;
  
  end_local._0_8_ = end.index;
  pos_local._0_1_ = end.value;
  end_local.index._0_1_ = start.value;
  guard.pos = pos;
  ExceptionGuard::ExceptionGuard((ExceptionGuard *)local_40,pos);
  while( true ) {
    bVar1 = Repeat<unsigned_char>::Iterator::operator!=
                      ((Iterator *)&end_local.index,(Iterator *)&pos_local);
    location = guard.start;
    if (!bVar1) break;
    IVar2 = Repeat<unsigned_char>::Iterator::operator++((Iterator *)&end_local.index,0);
    local_60[0].index = IVar2.index;
    local_60[0].value = IVar2.value;
    params = Repeat<unsigned_char>::Iterator::operator*(local_60);
    ctor<unsigned_char,unsigned_char_const&>(location,params);
    guard.start = guard.start + 1;
  }
  local_40 = (undefined1  [8])guard.start;
  ExceptionGuard::~ExceptionGuard((ExceptionGuard *)local_40);
  return location;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(*start);

    if (noexcept(T(*start))) {
      while (start != end) {
        ctor(*pos++, *start++);
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, *start++);
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }